

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,double *points,ON_BoundingBox *tight_bbox,
               int bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  ON_3dPoint *pOVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  double *pdVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ON_Xform *xform_00;
  double dVar12;
  ON_BoundingBox bbox;
  ON_3dPoint P;
  double local_c8;
  double local_b8;
  ON_BoundingBox local_b0;
  ON_3dPoint local_80;
  double local_68;
  ulong local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  ON_BoundingBox *local_38;
  
  if (bGrowBox == 0) {
    bVar7 = true;
  }
  else {
    bVar7 = ON_BoundingBox::IsNotEmpty(tight_bbox);
    bVar7 = !bVar7;
  }
  dVar5 = ON_BoundingBox::EmptyBoundingBox.m_max.z;
  dVar4 = ON_BoundingBox::EmptyBoundingBox.m_max.x;
  dVar3 = ON_BoundingBox::EmptyBoundingBox.m_min.z;
  dVar6 = ON_BoundingBox::EmptyBoundingBox.m_min.y;
  dVar12 = ON_BoundingBox::EmptyBoundingBox.m_min.x;
  if (bVar7) {
    (tight_bbox->m_max).y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
    (tight_bbox->m_max).z = dVar5;
    (tight_bbox->m_min).z = dVar3;
    (tight_bbox->m_max).x = dVar4;
    (tight_bbox->m_min).x = dVar12;
    (tight_bbox->m_min).y = dVar6;
  }
  if ((points == (double *)0x0 || (dim < 1 || count < 1)) ||
     ((count != 1 && (stride < (int)((uint)is_rat + dim))))) {
    if (bVar7) {
      return false;
    }
    return count == 0;
  }
  local_60 = CONCAT44(local_60._4_4_,stride);
  ON_BoundingBox::ON_BoundingBox(&local_b0);
  ON_3dPoint::ON_3dPoint(&local_80,0.0,0.0,0.0);
  local_38 = tight_bbox;
  if (xform == (ON_Xform *)0x0) {
    xform_00 = (ON_Xform *)0x0;
  }
  else {
    bVar7 = ON_Xform::IsIdentity(xform,0.0);
    xform_00 = (ON_Xform *)0x0;
    if (!bVar7) {
      xform_00 = xform;
    }
  }
  iVar9 = 3;
  if (dim < 3) {
    iVar9 = dim;
  }
  bVar7 = true;
  lVar11 = (long)(int)local_60;
  if (is_rat) {
    iVar10 = 1;
    if (count < 1) {
      iVar10 = count;
    }
    if ((points[(uint)dim] != 0.0) || (NAN(points[(uint)dim]))) {
      bVar7 = true;
    }
    else {
      pdVar8 = points + lVar11;
      do {
        points = pdVar8;
        if (count < 2) {
          bVar7 = false;
          count = iVar10 + -1;
          goto LAB_003e443a;
        }
        count = count + -1;
      } while ((points[(uint)dim] == 0.0) && (pdVar8 = points + lVar11, !NAN(points[(uint)dim])));
      bVar7 = false;
    }
LAB_003e443a:
    if (count < 1) {
      bVar1 = false;
      goto LAB_003e4a08;
    }
  }
  local_60 = (ulong)(uint)(iVar9 * 8);
  memcpy(&local_b0,points,local_60);
  if (is_rat) {
    dVar12 = 1.0 / points[(uint)dim];
    local_b0.m_min.x = local_b0.m_min.x * dVar12;
    local_b0.m_min.y = local_b0.m_min.y * dVar12;
    local_b0.m_min.z = dVar12 * local_b0.m_min.z;
  }
  if (xform_00 != (ON_Xform *)0x0) {
    ON_3dPoint::Transform(&local_b0.m_min,xform_00);
  }
  local_b0.m_max.z = local_b0.m_min.z;
  local_b0.m_max.x = local_b0.m_min.x;
  local_b0.m_max.y = local_b0.m_min.y;
  if (1 < count) {
    pdVar8 = points + lVar11;
    if (is_rat) {
      if (xform_00 == (ON_Xform *)0x0) {
        local_40 = local_b0.m_min.x;
        local_48 = local_b0.m_min.x;
        local_50 = local_b0.m_min.y;
        local_c8 = local_b0.m_min.y;
        local_58 = local_b0.m_min.z;
        local_b8 = local_b0.m_min.z;
        iVar9 = count + -1;
        do {
          dVar12 = pdVar8[(uint)dim];
          if ((dVar12 != 0.0) || (NAN(dVar12))) {
            local_68 = dVar12;
            memcpy(&local_80,pdVar8,local_60);
            dVar12 = 1.0 / local_68;
            local_80.x = local_80.x * dVar12;
            local_80.y = local_80.y * dVar12;
            local_80.z = dVar12 * local_80.z;
            dVar12 = local_80.x;
            dVar6 = local_80.x;
            if ((local_48 <= local_80.x) &&
               (dVar12 = local_b0.m_min.x, dVar6 = local_48, local_40 < local_80.x)) {
              local_b0.m_max.x = local_80.x;
              local_40 = local_80.x;
            }
            local_48 = dVar6;
            local_b0.m_min.x = dVar12;
            if (local_50 <= local_80.y) {
              pOVar2 = &local_b0.m_max;
              dVar12 = local_80.y;
              if (local_c8 < local_80.y) goto LAB_003e4874;
            }
            else {
              pOVar2 = &local_b0.m_min;
              dVar12 = local_c8;
              local_50 = local_80.y;
LAB_003e4874:
              pOVar2->y = local_80.y;
              local_c8 = dVar12;
            }
            if (local_58 <= local_80.z) {
              dVar12 = local_80.z;
              pOVar2 = &local_b0.m_max;
              if (local_80.z <= local_b8) goto LAB_003e48b9;
            }
            else {
              dVar12 = local_b8;
              local_58 = local_80.z;
              pOVar2 = &local_b0.m_min;
            }
            pOVar2->z = local_80.z;
            local_b8 = dVar12;
          }
          else {
            bVar7 = false;
          }
LAB_003e48b9:
          pdVar8 = pdVar8 + lVar11;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      else {
        iVar10 = count + -1;
        do {
          dVar12 = pdVar8[(uint)dim];
          if ((dVar12 != 0.0) || (NAN(dVar12))) {
            local_68 = dVar12;
            memcpy(&local_80,pdVar8,local_60);
            dVar12 = 1.0 / local_68;
            local_80.x = local_80.x * dVar12;
            local_80.y = local_80.y * dVar12;
            local_80.z = dVar12 * local_80.z;
            ON_3dPoint::Transform(&local_80,xform_00);
            if (local_b0.m_min.x <= local_80.x) {
              if (local_b0.m_max.x < local_80.x) {
                local_b0.m_max.x = local_80.x;
              }
            }
            else {
              local_b0.m_min.x = local_80.x;
            }
            pOVar2 = &local_b0.m_min;
            if ((local_80.y < local_b0.m_min.y) ||
               (pOVar2 = &local_b0.m_max, local_b0.m_max.y < local_80.y)) {
              pOVar2->y = local_80.y;
            }
            pOVar2 = &local_b0.m_min;
            if ((local_80.z < local_b0.m_min.z) ||
               (pOVar2 = &local_b0.m_max, local_b0.m_max.z < local_80.z)) {
              pOVar2->z = local_80.z;
            }
          }
          else {
            bVar7 = false;
          }
          pdVar8 = pdVar8 + lVar11;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
        if (dim < 3) {
          do {
            pdVar8 = ON_3dPoint::operator[](&local_b0.m_min,iVar9);
            *pdVar8 = 0.0;
            pdVar8 = ON_3dPoint::operator[](&local_b0.m_max,iVar9);
            *pdVar8 = 0.0;
            iVar9 = iVar9 + 1;
          } while (iVar9 != 3);
        }
      }
    }
    else if (xform_00 == (ON_Xform *)0x0) {
      local_58 = local_b0.m_min.x;
      local_b8 = local_b0.m_min.x;
      local_48 = local_b0.m_min.y;
      local_68 = local_b0.m_min.y;
      local_50 = local_b0.m_min.z;
      local_c8 = local_b0.m_min.z;
      iVar9 = count + -1;
      do {
        memcpy(&local_80,pdVar8,local_60);
        if (local_b8 <= local_80.x) {
          if (local_58 < local_80.x) {
            local_b0.m_max.x = local_80.x;
            local_58 = local_80.x;
          }
        }
        else {
          local_b0.m_min.x = local_80.x;
          local_b8 = local_80.x;
        }
        if (local_48 <= local_80.y) {
          pOVar2 = &local_b0.m_max;
          dVar12 = local_80.y;
          if (local_68 < local_80.y) goto LAB_003e49a4;
        }
        else {
          local_48 = local_80.y;
          dVar12 = local_68;
          pOVar2 = &local_b0.m_min;
LAB_003e49a4:
          pOVar2->y = local_80.y;
          local_68 = dVar12;
        }
        if (local_50 <= local_80.z) {
          dVar12 = local_80.z;
          pOVar2 = &local_b0.m_max;
          if (local_c8 < local_80.z) goto LAB_003e49e0;
        }
        else {
          local_50 = local_80.z;
          dVar12 = local_c8;
          pOVar2 = &local_b0.m_min;
LAB_003e49e0:
          pOVar2->z = local_80.z;
          local_c8 = dVar12;
        }
        pdVar8 = pdVar8 + lVar11;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
    }
    else {
      iVar10 = count + -1;
      do {
        memcpy(&local_80,pdVar8,local_60);
        ON_3dPoint::Transform(&local_80,xform_00);
        if (local_b0.m_min.x <= local_80.x) {
          if (local_b0.m_max.x < local_80.x) {
            local_b0.m_max.x = local_80.x;
          }
        }
        else {
          local_b0.m_min.x = local_80.x;
        }
        pOVar2 = &local_b0.m_min;
        if ((local_80.y < local_b0.m_min.y) ||
           (pOVar2 = &local_b0.m_max, local_b0.m_max.y < local_80.y)) {
          pOVar2->y = local_80.y;
        }
        pOVar2 = &local_b0.m_min;
        if ((local_80.z < local_b0.m_min.z) ||
           (pOVar2 = &local_b0.m_max, local_b0.m_max.z < local_80.z)) {
          pOVar2->z = local_80.z;
        }
        pdVar8 = pdVar8 + lVar11;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      if (dim < 3) {
        do {
          pdVar8 = ON_3dPoint::operator[](&local_b0.m_min,iVar9);
          *pdVar8 = 0.0;
          pdVar8 = ON_3dPoint::operator[](&local_b0.m_max,iVar9);
          *pdVar8 = 0.0;
          iVar9 = iVar9 + 1;
        } while (iVar9 != 3);
      }
    }
  }
  ON_BoundingBox::Union(local_38,&local_b0);
  bVar1 = true;
LAB_003e4a08:
  if (!bVar1) {
    return false;
  }
  return bVar7;
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const double* points, 
    ON_BoundingBox& tight_bbox,
    int bGrowBox,
    const ON_Xform* xform
    )
{
  // bounding box workhorse
  bool rc = false;
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }
  if ( is_rat )
  {
    is_rat = 1;
  }

  if ( count > 0 && dim > 0 && points && (count == 1 || stride >= dim+is_rat) ) 
  {
    ON_BoundingBox bbox;
    ON_3dPoint P(0.0,0.0,0.0);
    double w;
    int i, wi;

    if ( xform && xform->IsIdentity() )
    {
      xform = 0;
    }
    wi = dim;
    if ( dim > 3 )
    {
      dim = 3;
    }

    rc = true;
    if ( is_rat ) 
    {
      // skip bogus starting points
      while ( count > 0 && points[wi] == 0.0 ) 
      {
        count--;
        points += stride;
        rc = false;
      }
      if ( count <= 0 )
        return false;
    }

    memcpy( &bbox.m_min.x, points, dim*sizeof(bbox.m_min.x) );
    if ( is_rat )
    {
      w = 1.0/points[wi];
      bbox.m_min.x *= w; bbox.m_min.y *= w; bbox.m_min.z *= w;
    }
    if ( xform )
    {
      bbox.m_min.Transform(*xform);
    }
    bbox.m_max = bbox.m_min;
    points += stride;
    count--;

    if ( count > 0 ) 
    {
      if ( is_rat )
      {
        // homogeneous rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &P.x, points, dim*sizeof(P.x) );
            w = 1.0/w;
            P.x *= w; P.y *= w; P.z *= w;
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &P.x, points, dim*sizeof(P.x) );
            w = 1.0/w;
            P.x *= w; P.y *= w; P.z *= w;
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &P.x, points, dim*sizeof(P.x) );
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &P.x, points, dim*sizeof(P.x) );
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
    }

    tight_bbox.Union(bbox);
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = (0 == count);
  }

  return rc;
}